

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::writeDescriptorSet
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet,
          VkDescriptorSetLayout layout,VkPipelineLayout pipelineLayout)

{
  VkPipelineLayout local_58;
  VkDescriptorSetLayout local_50;
  VkDescriptorSet local_48;
  VkPipelineLayout local_40;
  VkDescriptorSetLayout local_38;
  VkDescriptorSet local_30;
  ImageSampleComputeInstance *local_28;
  ImageSampleComputeInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  VkDescriptorSetLayout layout_local;
  VkDescriptorSet descriptorSet_local;
  
  local_28 = this;
  this_local = (ImageSampleComputeInstance *)pipelineLayout.m_internal;
  pipelineLayout_local.m_internal = layout.m_internal;
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      local_38.m_internal = layout.m_internal;
      local_30.m_internal = descriptorSet.m_internal;
      ::vk::Handle<(vk::HandleType)16>::Handle(&local_40,0);
      writeSamplerDescriptorSetWithTemplate(this,local_30,local_38,false,local_40);
    }
    else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      local_50.m_internal = layout.m_internal;
      local_48.m_internal = descriptorSet.m_internal;
      ::vk::Handle<(vk::HandleType)16>::Handle(&local_58,0);
      writeImageSamplerDescriptorSetWithTemplate(this,local_48,local_50,false,local_58);
    }
  }
  else if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,true,pipelineLayout);
    }
    else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSetWithTemplate(this,descriptorSet,layout,true,pipelineLayout);
    }
  }
  else if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSet(this,descriptorSet);
    }
    else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSet(this,descriptorSet);
    }
  }
  else if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
      writeSamplerDescriptorSet(this,descriptorSet);
    }
    else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      writeImageSamplerDescriptorSet(this,descriptorSet);
    }
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeDescriptorSet (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, vk::VkPipelineLayout pipelineLayout)
{
	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSetWithTemplate(descriptorSet, layout);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSetWithTemplate(descriptorSet, layout);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSetWithTemplate(descriptorSet, layout, true, pipelineLayout);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSetWithTemplate(descriptorSet, layout, true, pipelineLayout);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSet(descriptorSet);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSet(descriptorSet);
		else
			DE_FATAL("Impossible");
	}
	else if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER)
			writeSamplerDescriptorSet(descriptorSet);
		else if (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			writeImageSamplerDescriptorSet(descriptorSet);
		else
			DE_FATAL("Impossible");
	}
}